

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle.hpp
# Opt level: O1

void __thiscall
MetaSim::Particle<JumpEvent,_AvgTimeStateStat>::clone_to
          (Particle<JumpEvent,_AvgTimeStateStat> *this,Event *e)

{
  AvgTimeStateStat *pAVar1;
  pointer *__ptr;
  __uniq_ptr_impl<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
  local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
  .super__Head_base<0UL,_MetaSim::ParticleInterface_*,_false>._M_head_impl =
       (tuple<MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>)
       operator_new(0x18);
  pAVar1 = this->staptr_;
  *(undefined ***)
   local_18._M_t.
   super__Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
   .super__Head_base<0UL,_MetaSim::ParticleInterface_*,_false>._M_head_impl =
       &PTR__ParticleInterface_001226e8;
  *(Event **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
          .super__Head_base<0UL,_MetaSim::ParticleInterface_*,_false>._M_head_impl + 8) = e;
  *(AvgTimeStateStat **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
          .super__Head_base<0UL,_MetaSim::ParticleInterface_*,_false>._M_head_impl + 0x10) = pAVar1;
  Event::addParticle(e,(unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
                        *)&local_18);
  if ((_Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
       )local_18._M_t.
        super__Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
        .super__Head_base<0UL,_MetaSim::ParticleInterface_*,_false>._M_head_impl !=
      (ParticleInterface *)0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
                          .super__Head_base<0UL,_MetaSim::ParticleInterface_*,_false>._M_head_impl +
                8))();
  }
  return;
}

Assistant:

virtual void clone_to(Event &e) {
            E& ent = static_cast<E&>(e);
            std::unique_ptr< ParticleInterface > p(new Particle<E, S>(ent, *staptr_));
            ent.addParticle(std::move(p));
        }